

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.h
# Opt level: O1

bool FileUtil::readDataLocally
               (string *data_path,vector<Rating,_std::allocator<Rating>_> *ratings,int min_row_index
               ,int max_row_index,int total_rating_num,int row_num)

{
  pointer pRVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  long *plVar6;
  void *pvVar7;
  void *pvVar8;
  ostream *poVar9;
  ulong uVar10;
  void *pvVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  bool bVar17;
  value_type_conflict1 *pvVar18;
  ifstream data_file;
  long local_238 [4];
  int aiStack_218 [122];
  
  std::ifstream::ifstream(local_238,(string *)data_path,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"cannot open ",0xc);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(data_path->_M_dataplus)._M_p,
                        data_path->_M_string_length);
    std::endl<char,std::char_traits<char>>(poVar9);
    exit(1);
  }
  std::istream::seekg((long)local_238,min_row_index * 8);
  iVar12 = max_row_index - min_row_index;
  uVar10 = 0xffffffffffffffff;
  if (-1 < iVar12) {
    uVar10 = (long)(iVar12 * 8) * 4;
  }
  pvVar5 = operator_new__(uVar10);
  plVar6 = (long *)std::istream::read((char *)local_238,(long)pvVar5);
  if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) == 0) {
    std::istream::seekg((long)local_238,total_rating_num << 3);
    uVar10 = 0xffffffffffffffff;
    if (-2 < row_num) {
      uVar10 = (long)(row_num * 4 + 4) * 4;
    }
    pvVar7 = operator_new__(uVar10);
    plVar6 = (long *)std::istream::read((char *)local_238,(long)pvVar7);
    if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) == 0) {
      std::istream::seekg((long)local_238,min_row_index * 4);
      uVar10 = 0xffffffffffffffff;
      if (-1 < iVar12) {
        uVar10 = (long)(iVar12 * 4) * 4;
      }
      pvVar8 = operator_new__(uVar10);
      plVar6 = (long *)std::istream::read((char *)local_238,(long)pvVar8);
      if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) == 0) {
        std::vector<Rating,_std::allocator<Rating>_>::resize(ratings,(long)iVar12);
        bVar2 = true;
        if (0 < row_num) {
          pRVar1 = (ratings->super__Vector_base<Rating,_std::allocator<Rating>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          bVar17 = false;
          uVar10 = 1;
          iVar13 = 0;
          do {
            iVar14 = *(int *)((long)pvVar7 + uVar10 * 4);
            if (min_row_index <= iVar14) {
              iVar4 = *(int *)((long)pvVar7 + uVar10 * 4 + -4);
              iVar15 = min_row_index;
              if ((min_row_index <= iVar4) && (iVar15 = iVar4, max_row_index <= iVar4)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Logical error!",0xe);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                bVar2 = false;
                break;
              }
              iVar14 = iVar14 - iVar4;
              if (max_row_index - iVar4 <= iVar14) {
                iVar14 = max_row_index - iVar4;
              }
              if (0 < iVar14) {
                lVar16 = (long)iVar13;
                pvVar18 = &pRVar1[lVar16].score;
                iVar4 = 0;
                do {
                  iVar3 = iVar4;
                  lVar16 = lVar16 + 1;
                  ((Rating *)(pvVar18 + -2))->global_id = iVar15;
                  *(int *)((long)pvVar18 + -0xc) = (int)uVar10 + -1;
                  *(int *)(pvVar18 + -1) = *(int *)((long)pvVar8 + lVar16 * 4 + -4);
                  *pvVar18 = *(value_type_conflict1 *)((long)pvVar5 + lVar16 * 8 + -8);
                  if (iVar12 <= lVar16) {
                    bVar17 = true;
                    break;
                  }
                  pvVar18 = pvVar18 + 3;
                  iVar4 = iVar3 + -1;
                  iVar15 = iVar15 + 1;
                } while (-iVar14 != iVar4);
                iVar13 = (iVar13 - iVar3) + 1;
              }
              if (bVar17) break;
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != row_num + 1);
        }
        if (!bVar2) goto LAB_0012367e;
        std::ifstream::close();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in reading col index from file!",0x25);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
        std::ostream::put('H');
        std::ostream::flush();
        bVar2 = false;
      }
      operator_delete__(pvVar5);
      pvVar11 = pvVar7;
      pvVar5 = pvVar8;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error in reading row index from file!",0x25);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
      bVar2 = false;
      pvVar11 = pvVar5;
      pvVar5 = pvVar7;
    }
    operator_delete__(pvVar11);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error in reading rating values from file!",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    bVar2 = false;
  }
  operator_delete__(pvVar5);
LAB_0012367e:
  std::ifstream::~ifstream(local_238);
  return bVar2;
}

Assistant:

bool readDataLocally(string data_path, vector<Rating> &ratings, const int min_row_index,
                         const int max_row_index, const int total_rating_num, const int row_num) {
        ifstream data_file(data_path);
        if(!data_file.good()){
            cerr << "cannot open " << data_path << endl;
            exit(1);
        }

        long long begin_skip = min_row_index * size_of_double;

        // scores
        data_file.seekg(begin_skip, std::ios_base::cur);

        long long size = (max_row_index - min_row_index) * size_of_double;
        int *score_rows = new int[size];
        if (!data_file.read(reinterpret_cast<char *>(score_rows), size)) {
            cerr << "Error in reading rating values from file!" << endl;
            delete[] score_rows;
            return false;
        }

        double *score_ptr = reinterpret_cast<double *>(score_rows);

        // row_index
        begin_skip = total_rating_num * size_of_double;
        data_file.seekg(begin_skip, std::ios_base::beg);
        long long size2 = size_of_int * (row_num + 1);
        int *row_nums = new int[size2];
        if (!data_file.read(reinterpret_cast<char *>(row_nums), size2)) {
            cerr << "Error in reading row index from file!" << endl;
            delete[] score_rows;
            delete[] row_nums;
            return false;
        }

        // col_index
        begin_skip = min_row_index * size_of_int;
        data_file.seekg(begin_skip, std::ios_base::cur);

        long long size3 = size_of_int * (max_row_index - min_row_index);

        int *col_indices = new int[size3];
        if (!data_file.read(reinterpret_cast<char *>(col_indices), size3)) {
            cerr << "Error in reading col index from file!" << endl;
            delete[] score_rows;
            delete[] row_nums;
            delete[] col_indices;
            return false;
        }

        // format data
        ratings.resize(max_row_index - min_row_index);
        int index = 0;
        int global_id_start = 0;
        int rating_num = 0;
        bool finish = false;
        for (int row_index = 1; row_index < row_num + 1; row_index++) {

            // accumulation includes row of row_index = row_nums[row_index];
            if (row_nums[row_index] < min_row_index) {
                continue;
            } else if (row_nums[row_index - 1] < min_row_index && row_nums[row_index] >= min_row_index) {
                global_id_start = min_row_index;
                rating_num = std::min(max_row_index - row_nums[row_index - 1],
                                      row_nums[row_index] - row_nums[row_index - 1]);
            } else if (row_nums[row_index - 1] >= min_row_index && row_nums[row_index - 1] < max_row_index) {
                global_id_start = row_nums[row_index - 1];
                rating_num = std::min(max_row_index - row_nums[row_index - 1],
                                      row_nums[row_index] - row_nums[row_index - 1]);
            } else {
                cerr << "Logical error!" << endl;
                return false;
            }

            for (int offset = 0; offset < rating_num; offset++) {
                ratings[index].global_id = global_id_start + offset;
                ratings[index].user_id = row_index - 1;
                ratings[index].item_id = col_indices[index];
                ratings[index].score = score_ptr[index];

                index++;
                if (index >= max_row_index - min_row_index) {
                    finish = true;
                    break;
                }
            }

            if (finish) {
                break;
            }
        }

        data_file.close();

        delete[] score_rows;
        delete[] row_nums;
        delete[] col_indices;

        return true;
    }